

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O3

void __thiscall SkipList::Print(SkipList *this)

{
  ostream *poVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  pNVar3 = this->header;
  if (pNVar3 != (Node *)0x0) {
    iVar2 = this->height;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n[",2);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] - ",4);
      pNVar4 = pNVar3;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ ",2);
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pNVar4->key);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,(pNVar4->val)._M_dataplus._M_p,(pNVar4->val)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
        if (pNVar4->next == (Node *)0x0) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        pNVar4 = pNVar4->next;
      } while (pNVar4 != (Node *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      iVar2 = iVar2 + -1;
      pNVar3 = pNVar3->bot;
    } while (pNVar3 != (Node *)0x0);
  }
  return;
}

Assistant:

void SkipList::Print() const
{
	Node* head = header;
	int lvl = height;
	while(head)
	{
		std::cout << "\n[" << lvl << "] - ";
		Node* node = head;
		while(node)
		{
			std::cout << "{ " << node->key << " " << node->val << " }";
			if (node->next)
			{
				std::cout << ", ";
			}
			node = node->next;
		}
		std::cout << "\n";
		head = head->bot;
		lvl--;
	}
}